

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_read_s16__alaw(drwav *pWav,drwav_uint64 samplesToRead,drwav_int16 *pBufferOut)

{
  ushort uVar1;
  ulong samplesToRead_00;
  drwav_uint64 dVar2;
  size_t i;
  drwav_uint64 dVar3;
  uint uVar4;
  drwav_uint64 dVar5;
  uchar sampleData [4096];
  byte local_1038 [4104];
  
  uVar1 = pWav->bitsPerSample;
  if ((uVar1 < 8) || ((uVar1 & 7) != 0)) {
    uVar4 = (uint)(pWav->fmt).blockAlign / (uint)(pWav->fmt).channels;
  }
  else {
    uVar4 = (uint)(uVar1 >> 3);
  }
  dVar5 = 0;
  if (uVar4 != 0) {
    do {
      if (samplesToRead == 0) {
        return dVar5;
      }
      samplesToRead_00 = 0x1000 / (ulong)uVar4;
      if (samplesToRead < 0x1000 / (ulong)uVar4) {
        samplesToRead_00 = samplesToRead;
      }
      dVar2 = drwav_read(pWav,samplesToRead_00,local_1038);
      if (dVar2 != 0) {
        dVar3 = 0;
        do {
          pBufferOut[dVar3] = g_drwavAlawTable[local_1038[dVar3]];
          dVar3 = dVar3 + 1;
        } while (dVar2 != dVar3);
        pBufferOut = pBufferOut + dVar2;
        samplesToRead = samplesToRead - dVar2;
        dVar5 = dVar5 + dVar2;
      }
    } while (dVar2 != 0);
  }
  return dVar5;
}

Assistant:

drwav_uint64 drwav_read_s16__alaw(drwav* pWav, drwav_uint64 samplesToRead, drwav_int16* pBufferOut)
{
    drwav_uint32 bytesPerSample = drwav_get_bytes_per_sample(pWav);
    if (bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData)/bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav_alaw_to_s16(pBufferOut, sampleData, (size_t)samplesRead);

        pBufferOut       += samplesRead;
        samplesToRead    -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}